

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::number_base::write_decimal<long_long,std::ostream>
          (number_base *this,longlong value,basic_ostream<char,_std::char_traits<char>_> *os)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  long lVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  
  lVar6 = *(long *)(*(long *)os + -0x18);
  pbVar8 = os + lVar6 + 0x18;
  uVar1 = *(uint *)pbVar8;
  uVar2 = this->base_;
  uVar3 = uVar1;
  if (uVar2 == 8) {
    if (value != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"0",1);
      lVar6 = *(long *)(*(long *)os + -0x18);
      uVar3 = *(uint *)(os + lVar6 + 0x18);
    }
    pbVar7 = os + lVar6 + 0x18;
    uVar5 = 0x40;
  }
  else {
    uVar5 = 2;
    pbVar7 = pbVar8;
    if (uVar2 != 10) {
      if (uVar2 != 0x10) {
        assert_failed("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/dump/value.hpp"
                      ,0xa3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
      pbVar7 = os + *(long *)(*(long *)os + -0x18) + 0x18;
      uVar3 = *(uint *)pbVar7;
      uVar5 = 8;
    }
  }
  *(uint *)pbVar7 = uVar3 & 0xffffffb5 | uVar5;
  poVar4 = std::ostream::_M_insert<long_long>((longlong)os);
  *(uint *)pbVar8 = uVar1;
  return poVar4;
}

Assistant:

OStream & write_decimal (T value, OStream & os) const {
                ios_flags_saver const _{os};
                switch (base_) {
                case 16: os << "0x" << std::hex; break;
                case 8:
                    if (value != 0) {
                        os << "0";
                    }
                    os << std::oct;
                    break;
                case 10: os << std::dec; break;
                default: PSTORE_ASSERT (0); break;
                }
                return os << value;
            }